

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O2

void flatbuffers::Print<void_const*>
               (void *val,Type type,int indent,int indent_step,StructDef *union_sd,string *_text)

{
  Type type_00;
  Type type_01;
  Type type_02;
  Type type_03;
  Type type_04;
  Type type_05;
  Type type_06;
  Type type_07;
  Type type_08;
  Type type_09;
  Type type_10;
  uchar i;
  uint i_00;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  switch(type.base_type) {
  case BASE_TYPE_STRING:
    std::__cxx11::string::append((char *)_text);
    for (i_00 = 0; i_00 < *val; i_00 = i_00 + 1) {
      i = Vector<char>::Get((Vector<char> *)val,i_00);
      if ((((i == '\t') || (i == '\\')) || (i == '\r')) || ((i == '\"' || (i == '\n')))) {
        std::__cxx11::string::append((char *)_text);
      }
      else if ((byte)(i - 0x20) < 0x5f) {
        std::__cxx11::string::push_back((char)_text);
      }
      else {
        IntToStringHex<unsigned_char>(&local_70,i);
        std::operator+(&local_50,"\\x",&local_70);
        std::__cxx11::string::append((string *)_text);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
      }
    }
    std::__cxx11::string::append((char *)_text);
    break;
  case BASE_TYPE_VECTOR:
    switch(type.element) {
    case BASE_TYPE_NONE:
    case BASE_TYPE_UTYPE:
    case BASE_TYPE_BOOL:
    case BASE_TYPE_UCHAR:
      type_00.element = BASE_TYPE_NONE;
      type_00.base_type = type.element;
      type_00.struct_def = type.struct_def;
      type_00.enum_def = (EnumDef *)0x0;
      PrintVector<unsigned_char>((Vector<unsigned_char> *)val,type_00,indent,indent_step,_text);
      return;
    case BASE_TYPE_CHAR:
      type_03.element = BASE_TYPE_NONE;
      type_03.base_type = type.element;
      type_03.struct_def = type.struct_def;
      type_03.enum_def = (EnumDef *)0x0;
      PrintVector<signed_char>((Vector<signed_char> *)val,type_03,indent,indent_step,_text);
      return;
    case BASE_TYPE_SHORT:
      type_07.element = BASE_TYPE_NONE;
      type_07.base_type = type.element;
      type_07.struct_def = type.struct_def;
      type_07.enum_def = (EnumDef *)0x0;
      PrintVector<short>((Vector<short> *)val,type_07,indent,indent_step,_text);
      return;
    case BASE_TYPE_USHORT:
      type_08.element = BASE_TYPE_NONE;
      type_08.base_type = type.element;
      type_08.struct_def = type.struct_def;
      type_08.enum_def = (EnumDef *)0x0;
      PrintVector<unsigned_short>((Vector<unsigned_short> *)val,type_08,indent,indent_step,_text);
      return;
    case BASE_TYPE_INT:
      type_06.element = BASE_TYPE_NONE;
      type_06.base_type = type.element;
      type_06.struct_def = type.struct_def;
      type_06.enum_def = (EnumDef *)0x0;
      PrintVector<int>((Vector<int> *)val,type_06,indent,indent_step,_text);
      return;
    case BASE_TYPE_UINT:
      type_10.element = BASE_TYPE_NONE;
      type_10.base_type = type.element;
      type_10.struct_def = type.struct_def;
      type_10.enum_def = (EnumDef *)0x0;
      PrintVector<unsigned_int>((Vector<unsigned_int> *)val,type_10,indent,indent_step,_text);
      return;
    case BASE_TYPE_LONG:
      type_05.element = BASE_TYPE_NONE;
      type_05.base_type = type.element;
      type_05.struct_def = type.struct_def;
      type_05.enum_def = (EnumDef *)0x0;
      PrintVector<long>((Vector<long> *)val,type_05,indent,indent_step,_text);
      return;
    case BASE_TYPE_ULONG:
      type_09.element = BASE_TYPE_NONE;
      type_09.base_type = type.element;
      type_09.struct_def = type.struct_def;
      type_09.enum_def = (EnumDef *)0x0;
      PrintVector<unsigned_long>((Vector<unsigned_long> *)val,type_09,indent,indent_step,_text);
      return;
    case BASE_TYPE_FLOAT:
      type_02.element = BASE_TYPE_NONE;
      type_02.base_type = type.element;
      type_02.struct_def = type.struct_def;
      type_02.enum_def = (EnumDef *)0x0;
      PrintVector<float>((Vector<float> *)val,type_02,indent,indent_step,_text);
      return;
    case BASE_TYPE_DOUBLE:
      type_04.element = BASE_TYPE_NONE;
      type_04.base_type = type.element;
      type_04.struct_def = type.struct_def;
      type_04.enum_def = (EnumDef *)0x0;
      PrintVector<double>((Vector<double> *)val,type_04,indent,indent_step,_text);
      return;
    case BASE_TYPE_STRING:
    case BASE_TYPE_VECTOR:
    case BASE_TYPE_STRUCT:
    case BASE_TYPE_UNION:
      type_01.element = BASE_TYPE_NONE;
      type_01.base_type = type.element;
      type_01.struct_def = type.struct_def;
      type_01.enum_def = (EnumDef *)0x0;
      PrintVector<flatbuffers::Offset<void>>
                ((Vector<flatbuffers::Offset<void>_> *)val,type_01,indent,indent_step,_text);
      return;
    }
    break;
  case BASE_TYPE_STRUCT:
    goto LAB_00115ff8;
  case BASE_TYPE_UNION:
    type.struct_def = union_sd;
    if (union_sd == (StructDef *)0x0) {
      __assert_fail("union_sd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/src/idl_gen_text.cpp"
                    ,99,
                    "void flatbuffers::Print(const void *, Type, int, int, StructDef *, std::string *)"
                   );
    }
LAB_00115ff8:
    GenStruct(type.struct_def,(Table *)val,indent,indent_step,_text);
    return;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/src/idl_gen_text.cpp"
                  ,0x82,
                  "void flatbuffers::Print(const void *, Type, int, int, StructDef *, std::string *)"
                 );
  }
  return;
}

Assistant:

void Print<const void *>(const void *val,
                                    Type type, int indent, int indent_step,
                                    StructDef *union_sd, std::string *_text) {
  switch (type.base_type) {
    case BASE_TYPE_UNION:
      // If this assert hits, you have an corrupt buffer, a union type field
      // was not present or was out of range.
      assert(union_sd);
      GenStruct(*union_sd,
                reinterpret_cast<const Table *>(val),
                indent,
                indent_step,
                _text);
      break;
    case BASE_TYPE_STRUCT:
      GenStruct(*type.struct_def,
                reinterpret_cast<const Table *>(val),
                indent,
                indent_step,
                _text);
      break;
    case BASE_TYPE_STRING: {
      EscapeString(*reinterpret_cast<const String *>(val), _text);
      break;
    }
    case BASE_TYPE_VECTOR:
      type = type.VectorType();
      // Call PrintVector above specifically for each element type:
      switch (type.base_type) {
        #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, JTYPE) \
          case BASE_TYPE_ ## ENUM: \
            PrintVector<CTYPE>( \
              *reinterpret_cast<const Vector<CTYPE> *>(val), \
              type, indent, indent_step, _text); break;
          FLATBUFFERS_GEN_TYPES(FLATBUFFERS_TD)
        #undef FLATBUFFERS_TD
      }
      break;
    default: assert(0);
  }
}